

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_bddPrintCover(DdManager *dd,DdNode *l,DdNode *u)

{
  DdNode *pDVar1;
  int iVar2;
  DdNode *pDVar3;
  int local_5c;
  DdNode *pDStack_58;
  int length;
  DdNode *tmp;
  DdNode *prime;
  DdNode *implicant;
  DdNode *lb;
  int result;
  int q;
  int *array;
  DdNode *u_local;
  DdNode *l_local;
  DdManager *dd_local;
  
  array = (int *)u;
  u_local = l;
  l_local = &dd->sentinel;
  iVar2 = Cudd_ReadSize(dd);
  _result = (int *)malloc((long)iVar2 << 2);
  if (_result == (int *)0x0) {
    dd_local._4_4_ = 0;
  }
  else {
    implicant = u_local;
    *(int *)(((ulong)u_local & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)u_local & 0xfffffffffffffffe) + 4) + 1;
    while (pDVar1 = implicant, pDVar3 = Cudd_ReadLogicZero((DdManager *)l_local), pDVar1 != pDVar3)
    {
      prime = Cudd_LargestCube((DdManager *)l_local,implicant,&local_5c);
      if (prime == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)l_local,implicant);
        if (_result != (int *)0x0) {
          free(_result);
        }
        return 0;
      }
      *(int *)(((ulong)prime & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)prime & 0xfffffffffffffffe) + 4) + 1;
      tmp = Cudd_bddMakePrime((DdManager *)l_local,prime,(DdNode *)array);
      if (tmp == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)l_local,implicant);
        Cudd_RecursiveDeref((DdManager *)l_local,prime);
        if (_result != (int *)0x0) {
          free(_result);
        }
        return 0;
      }
      *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref((DdManager *)l_local,prime);
      pDStack_58 = Cudd_bddAnd((DdManager *)l_local,implicant,(DdNode *)((ulong)tmp ^ 1));
      if (pDStack_58 == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)l_local,implicant);
        Cudd_RecursiveDeref((DdManager *)l_local,tmp);
        if (_result != (int *)0x0) {
          free(_result);
        }
        return 0;
      }
      *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref((DdManager *)l_local,implicant);
      implicant = pDStack_58;
      lb._0_4_ = Cudd_BddToCubeArray((DdManager *)l_local,tmp,_result);
      if ((int)lb == 0) {
        Cudd_RecursiveDeref((DdManager *)l_local,implicant);
        Cudd_RecursiveDeref((DdManager *)l_local,tmp);
        if (_result != (int *)0x0) {
          free(_result);
        }
        return 0;
      }
      for (lb._4_4_ = 0; lb._4_4_ < *(int *)&l_local[3].type; lb._4_4_ = lb._4_4_ + 1) {
        iVar2 = _result[lb._4_4_];
        if (iVar2 == 0) {
          fprintf((FILE *)l_local[0xf].next,"0");
        }
        else if (iVar2 == 1) {
          fprintf((FILE *)l_local[0xf].next,"1");
        }
        else if (iVar2 == 2) {
          fprintf((FILE *)l_local[0xf].next,"-");
        }
        else {
          fprintf((FILE *)l_local[0xf].next,"?");
        }
      }
      fprintf((FILE *)l_local[0xf].next," 1\n");
      Cudd_RecursiveDeref((DdManager *)l_local,tmp);
    }
    fprintf((FILE *)l_local[0xf].next,"\n");
    Cudd_RecursiveDeref((DdManager *)l_local,implicant);
    if (_result != (int *)0x0) {
      free(_result);
    }
    dd_local._4_4_ = 1;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_bddPrintCover(
  DdManager *dd,
  DdNode *l,
  DdNode *u)
{
    int *array;
    int q, result;
    DdNode *lb;
#ifdef DD_DEBUG
    DdNode *cover;
#endif

    array = ABC_ALLOC(int, Cudd_ReadSize(dd));
    if (array == NULL) return(0);
    lb = l;
    cuddRef(lb);
#ifdef DD_DEBUG
    cover = Cudd_ReadLogicZero(dd);
    cuddRef(cover);
#endif
    while (lb != Cudd_ReadLogicZero(dd)) {
        DdNode *implicant, *prime, *tmp;
        int length;
        implicant = Cudd_LargestCube(dd,lb,&length);
        if (implicant == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,u);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,implicant);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,lb,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,lb);
        lb = tmp;
        result = Cudd_BddToCubeArray(dd,prime,array);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        for (q = 0; q < dd->size; q++) {
            switch (array[q]) {
            case 0:
                (void) fprintf(dd->out, "0");
                break;
            case 1:
                (void) fprintf(dd->out, "1");
                break;
            case 2:
                (void) fprintf(dd->out, "-");
                break;
            default:
                (void) fprintf(dd->out, "?");
            }
        }
        (void) fprintf(dd->out, " 1\n");
#ifdef DD_DEBUG
        tmp = Cudd_bddOr(dd,prime,cover);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,cover);
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cover);
        cover = tmp;
#endif
        Cudd_RecursiveDeref(dd,prime);
    }
    (void) fprintf(dd->out, "\n");
    Cudd_RecursiveDeref(dd,lb);
    ABC_FREE(array);
#ifdef DD_DEBUG
    if (!Cudd_bddLeq(dd,cover,u) || !Cudd_bddLeq(dd,l,cover)) {
        Cudd_RecursiveDeref(dd,cover);
        return(0);
    }
    Cudd_RecursiveDeref(dd,cover);
#endif
    return(1);

}